

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marketgenerator.cpp
# Opt level: O3

void __thiscall hedg::MarketGenerator::generate(MarketGenerator *this)

{
  uint *puVar1;
  _func_int ***ppp_Var2;
  pthread_mutex_t *__mutex;
  undefined8 __n;
  byte bVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  uint *puVar7;
  uint *puVar8;
  long lVar9;
  undefined8 *puVar10;
  int *piVar11;
  time_unit tVar12;
  ulong in_RCX;
  string *end_time_;
  ulong uVar13;
  char cVar14;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  byte *pbVar15;
  undefined4 uVar16;
  byte *pbVar17;
  execution_context eVar18;
  uint *puVar19;
  uint *puVar20;
  int iVar21;
  uint uVar22;
  service *psVar23;
  string *end_point_;
  pointer pcVar24;
  byte *pbVar25;
  byte *pbVar26;
  uint *puVar27;
  bool bVar28;
  bool bVar29;
  long *local_7f0;
  service_type *psStack_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  byte *local_7d0;
  void *pvStack_7c8;
  int local_7bc;
  pthread_mutex_t *local_7b8;
  uint *local_7b0;
  io_service service;
  string country_code;
  string event_type;
  string m_tm;
  string local_730;
  string local_710;
  string m_id;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string end_time;
  string start_time;
  Market_Projection local_538;
  undefined1 local_4d8 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  _Alloc_hider local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  _Alloc_hider local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  context context;
  system_error e;
  market_catalogue local_150;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->mut_);
  if (iVar4 == 0) {
    local_7b8 = (pthread_mutex_t *)&this->mut_;
    do {
      tVar12 = (time_unit)in_RCX;
      Betfair_Auth::get_session_id_abi_cxx11_();
      std::__cxx11::string::operator=((string *)this,(string *)&e);
      if ((error_code *)e._0_8_ != &e.m_error_code) {
        operator_delete((void *)e._0_8_,e.m_error_code._0_8_ + 1);
      }
      Timing::now_abi_cxx11_();
      Timing::after_abi_cxx11_
                (&end_time,(Timing *)(long)this->time_span_,(ulong)this->time_unit_,tVar12);
      boost::asio::io_context::io_context(&service);
      boost::asio::ssl::context::context(&context,tlsv12_client);
      Client<hedg::Rest_Client>::Client
                ((Client<hedg::Rest_Client> *)&e,(string *)config::betting_host_abi_cxx11_,
                 (string *)config::betting_port_abi_cxx11_,&service,&context);
      local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
      pcVar24 = (this->session_id_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5f0,pcVar24,pcVar24 + (this->session_id_)._M_string_length);
      local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_610,start_time._M_dataplus._M_p,
                 start_time._M_dataplus._M_p + start_time._M_string_length);
      local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_630,end_time._M_dataplus._M_p,
                 end_time._M_dataplus._M_p + end_time._M_string_length);
      local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_650,config::market_catalogue_endpoint_abi_cxx11_,
                 DAT_001f1808 + config::market_catalogue_endpoint_abi_cxx11_);
      local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_670,config::event_type_ids_abi_cxx11_,
                 DAT_001f1928 + config::event_type_ids_abi_cxx11_);
      local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_690,config::market_type_codes_abi_cxx11_,
                 DAT_001f1768 + config::market_type_codes_abi_cxx11_);
      local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6b0,config::market_countries_abi_cxx11_,
                 DAT_001f1948 + config::market_countries_abi_cxx11_);
      local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6d0,config::max_results_abi_cxx11_,
                 DAT_001f17a8 + config::max_results_abi_cxx11_);
      local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5b0,config::market_projection_abi_cxx11_,
                 DAT_001f17e8 + config::market_projection_abi_cxx11_);
      end_time_ = &local_630;
      end_point_ = &local_650;
      params::market_catalogue::market_catalogue
                (&local_150,&local_5f0,&local_610,end_time_,end_point_,&local_670,&local_690,
                 &local_6b0,&local_6d0,&local_5b0);
      iVar4 = (int)end_point_;
      Client<hedg::Rest_Client>::
      send_request<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::market_catalogue>
                ((Client<hedg::Rest_Client> *)&e,rest::message<hedg::params::market_catalogue>,
                 &local_150);
      params::market_catalogue::~market_catalogue(&local_150);
      pvVar6 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
        operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
        pvVar6 = extraout_RDX_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
        operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
        pvVar6 = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
        operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
        pvVar6 = extraout_RDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_690._M_dataplus._M_p != &local_690.field_2) {
        operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
        pvVar6 = extraout_RDX_03;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670._M_dataplus._M_p != &local_670.field_2) {
        operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
        pvVar6 = extraout_RDX_04;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_650._M_dataplus._M_p != &local_650.field_2) {
        operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
        pvVar6 = extraout_RDX_05;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_630._M_dataplus._M_p != &local_630.field_2) {
        operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
        pvVar6 = extraout_RDX_06;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610._M_dataplus._M_p != &local_610.field_2) {
        operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
        pvVar6 = extraout_RDX_07;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
        operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
        pvVar6 = extraout_RDX_08;
      }
      Rest_Client::recv_abi_cxx11_
                ((Rest_Client *)local_4d8,(int)(Client<hedg::Rest_Client> *)&e,pvVar6,
                 (size_t)end_time_,iVar4);
      __n = local_4d8._8_8_;
      if (((ulong)local_4d8._8_8_ < (service_type *)0xffffffffffffffe0) &&
         (pvVar6 = operator_new__((ulong)&(((execution_context_service_base<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>_>
                                             *)local_4d8._8_8_)->super_service).next_,
                                  (nothrow_t *)&std::nothrow), pcVar24 = (pointer)local_4d8._0_8_,
         pvVar6 != (void *)0x0)) {
        puVar10 = (undefined8 *)
                  ((long)pvVar6 +
                  (long)&(((execution_context_service_base<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>_>
                            *)__n)->super_service).key_.id_);
        *puVar10 = 0;
        puVar10[1] = 0;
        *(undefined8 *)((long)pvVar6 + __n) = 0;
        ((undefined8 *)((long)pvVar6 + __n))[1] = 0;
        memcpy(pvVar6,(void *)local_4d8._0_8_,__n);
      }
      else {
        pvVar6 = (void *)0x0;
        pcVar24 = (pointer)local_4d8._0_8_;
      }
      if (pcVar24 != local_4d8 + 0x10) {
        operator_delete(pcVar24,local_4d8._16_8_ + 1);
      }
      local_7f0 = (long *)0x0;
      psStack_7e8 = (service_type *)0x0;
      local_7e0 = 0xffffffff;
      local_7d8 = 0x400;
      local_7d0 = (byte *)0x0;
      pvStack_7c8 = (void *)0x0;
      if ((ulong)__n >> 0x20 != 0) {
        iVar4 = 1;
LAB_0015a7a2:
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar10 = &PTR__exception_001eae70;
        *(int *)(puVar10 + 1) = iVar4;
        __cxa_throw(puVar10,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
      }
      psStack_7e8 = (service_type *)0x0;
      local_7d0 = (byte *)operator_new__((ulong)(__n * 5) / 3 + 0x5f & 0x7ffffffc0,
                                         (nothrow_t *)&std::nothrow);
      pvStack_7c8 = operator_new__(0x2000,(nothrow_t *)&std::nothrow);
      iVar4 = (**(code **)(*simdjson::active_implementation + 0x18))
                        (simdjson::active_implementation,__n,0x400,&local_7f0);
      if (iVar4 != 0) goto LAB_0015a7a2;
      psStack_7e8 = (service_type *)__n;
      local_7d8 = 0x400;
      iVar4 = (**(code **)(*local_7f0 + 8))(local_7f0,pvVar6,__n,0);
      if (iVar4 != 0) goto LAB_0015a7a2;
      puVar1 = (uint *)local_7f0[2];
      iVar4 = 0x10;
      if (*(char *)((long)pvVar6 + (ulong)*puVar1) != '[') goto LAB_0015a7a2;
      if ((int)local_7f0[1] == 0) {
        __assert_fail("n_structural_indexes > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                      ,0x63ce,
                      "token_position simdjson::fallback::ondemand::json_iterator::last_position() const"
                     );
      }
      if (*(char *)((long)pvVar6 +
                   (ulong)*(uint *)(local_7f0[2] + (ulong)((int)local_7f0[1] - 1) * 4)) != ']') {
        iVar4 = 0x1b;
        goto LAB_0015a7a2;
      }
      puVar20 = puVar1 + 1;
      cVar14 = *(char *)((long)pvVar6 + (ulong)*puVar20);
      if (cVar14 == ']') {
        puVar20 = puVar1 + 2;
        iVar21 = 0;
      }
      else {
        *(uint **)((long)pvStack_7c8 + 8) = puVar1;
        iVar21 = 2;
      }
      if (((long)puVar20 - (long)puVar1 != 8) && ((long)puVar20 - (long)puVar1 != 4)) {
        iVar4 = 0x19;
        goto LAB_0015a7a2;
      }
      if (cVar14 != ']') {
        iVar4 = 0;
        pbVar26 = local_7d0;
LAB_001588a8:
        if (iVar4 == 0) {
          if (puVar20 <= puVar1) goto LAB_0015b0e9;
          if (iVar21 != 2) {
            __assert_fail("_json_iter->_depth == _depth + 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                          ,0x6782,
                          "void simdjson::fallback::ondemand::value_iterator::assert_at_child() const"
                         );
          }
          local_7bc = iVar4;
          if (*(char *)((long)pvVar6 + (ulong)*puVar20) == '{') {
            puVar27 = puVar20 + 1;
            *(uint **)((long)pvStack_7c8 + 0x10) = puVar20;
            bVar28 = *(char *)((long)pvVar6 + (ulong)puVar20[1]) == '}';
            uVar5 = 2;
            if (bVar28) {
              uVar5 = 1;
            }
            puVar7 = puVar20 + (ulong)bVar28 + 1;
            bVar29 = true;
            if (bVar28) {
              if (uVar5 < 2) {
                if (uVar5 != 1) {
LAB_0015a809:
                  uVar16 = 0x19;
                  goto LAB_0015a6c0;
                }
                *(uint **)((long)pvStack_7c8 + 0x10) = puVar20;
                uVar5 = 2;
                puVar8 = puVar7;
                if (*(char *)((long)pvVar6 + (ulong)puVar20[1]) == '}') {
                  uVar5 = 1;
                  bVar28 = false;
                  puVar7 = puVar20 + 2;
                }
                else {
                  bVar28 = true;
                  puVar7 = puVar27;
                }
              }
              else {
                if (uVar5 != 2) {
                  uVar22 = *puVar7;
                  puVar7 = puVar7 + 1;
                  bVar3 = *(byte *)((long)pvVar6 + (ulong)uVar22);
                  if (bVar3 < 0x5d) {
                    if ((bVar3 != 0x2c) && ((bVar3 != 0x3a && (bVar3 != 0x5b)))) {
joined_r0x0015898b:
                      uVar5 = uVar5 - 1;
                      if (uVar5 < 3) goto LAB_00158a06;
                    }
                  }
                  else if ((bVar3 == 0x7d) || (bVar3 != 0x7b)) goto joined_r0x0015898b;
                  uVar16 = 3;
                  uVar22 = uVar5;
                  if (puVar7 < (uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2])) {
                    do {
                      uVar5 = *puVar7;
                      puVar7 = puVar7 + 1;
                      bVar3 = *(byte *)((long)pvVar6 + (ulong)uVar5);
                      if (bVar3 < 0x7b) {
                        if (bVar3 == 0x5b) {
LAB_001589df:
                          uVar22 = uVar22 + 1;
                        }
                        else if (bVar3 == 0x5d) goto LAB_001589e5;
                      }
                      else {
                        if (bVar3 != 0x7d) {
                          if (bVar3 != 0x7b) goto LAB_001589ed;
                          goto LAB_001589df;
                        }
LAB_001589e5:
                        uVar5 = uVar22 - 1;
                        bVar28 = (int)uVar22 < 4;
                        uVar22 = uVar5;
                        if (bVar28) goto LAB_00158a06;
                      }
LAB_001589ed:
                      if ((uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2]) <= puVar7)
                      break;
                    } while( true );
                  }
                  goto LAB_0015a6c0;
                }
LAB_00158a06:
                if (puVar7 <= puVar20) goto LAB_0015b003;
                if (uVar5 != 2) goto LAB_0015b022;
                bVar28 = true;
                uVar5 = 2;
                if (*(char *)((long)pvVar6 + (ulong)*puVar7) != ',') {
                  if (*(char *)((long)pvVar6 + (ulong)*puVar7) != '}') {
LAB_0015a6bb:
                    uVar16 = 3;
                    goto LAB_0015a6c0;
                  }
                  uVar5 = 1;
                  bVar28 = false;
                }
                if (*(uint **)((long)pvStack_7c8 + 0x10) != puVar20) goto LAB_0015a809;
                bVar29 = false;
                puVar8 = puVar7;
                puVar7 = puVar7 + 1;
              }
            }
            else {
              bVar28 = true;
              puVar8 = puVar27;
            }
            if (bVar28) {
              do {
                if (uVar5 != 2) goto LAB_0015af16;
                if (puVar7 <= puVar20) goto LAB_0015b003;
                uVar13 = (ulong)*puVar7;
                uVar16 = 3;
                if ((*(char *)((long)pvVar6 + uVar13) != '\"') ||
                   (*(char *)((long)pvVar6 + (ulong)puVar7[1]) != ':')) goto LAB_0015a6c0;
                if ((*(char *)((long)pvVar6 + uVar13 + 9) == '\"') &&
                   (*(long *)((long)pvVar6 + uVar13 + 1) == 0x644974656b72616d)) goto LAB_00158ce7;
                puVar19 = puVar7 + 3;
                uVar5 = *(byte *)((long)pvVar6 + (ulong)puVar7[2]) - 0x2c;
                if (((uVar5 < 0x30) && ((0x800000004001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
                   (iVar4 = 2, *(byte *)((long)pvVar6 + (ulong)puVar7[2]) == 0x7b)) {
                  if (puVar19 < (uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2])) {
                    iVar21 = 3;
                    do {
                      uVar5 = *puVar19;
                      puVar19 = puVar19 + 1;
                      bVar3 = *(byte *)((long)pvVar6 + (ulong)uVar5);
                      if (bVar3 < 0x7b) {
                        if (bVar3 == 0x5b) {
LAB_00158b18:
                          iVar21 = iVar21 + 1;
                        }
                        else if (bVar3 == 0x5d) goto LAB_00158b1e;
                      }
                      else {
                        if (bVar3 != 0x7d) {
                          if (bVar3 != 0x7b) goto LAB_00158b26;
                          goto LAB_00158b18;
                        }
LAB_00158b1e:
                        iVar4 = iVar21 + -1;
                        bVar28 = iVar21 < 4;
                        iVar21 = iVar4;
                        if (bVar28) goto LAB_00158b3e;
                      }
LAB_00158b26:
                      if ((uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2]) <= puVar19)
                      goto LAB_0015a6bb;
                    } while( true );
                  }
                  goto LAB_0015a6c0;
                }
LAB_00158b3e:
                if (puVar19 <= puVar20) goto LAB_0015b003;
                if (iVar4 != 2) goto LAB_0015b022;
                bVar28 = true;
                uVar5 = 2;
                if (*(char *)((long)pvVar6 + (ulong)*puVar19) != ',') {
                  if (*(char *)((long)pvVar6 + (ulong)*puVar19) != '}') goto LAB_0015a6c0;
                  uVar5 = 1;
                  bVar28 = false;
                }
                puVar7 = puVar19 + 1;
              } while (bVar28);
            }
            uVar16 = 0x13;
            if (bVar29) {
LAB_0015a6c0:
              puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
              *puVar10 = &PTR__exception_001eae70;
              *(undefined4 *)(puVar10 + 1) = uVar16;
              __cxa_throw(puVar10,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
            }
            *(uint **)((long)pvStack_7c8 + 0x10) = puVar20;
            bVar28 = *(char *)((long)pvVar6 + (ulong)puVar20[1]) != '}';
            if (bVar28) {
              cVar14 = bVar28 + '\x01';
              puVar7 = puVar27;
              while( true ) {
                if (cVar14 != '\x02') goto LAB_0015af9e;
                if (puVar7 <= puVar20) goto LAB_0015b003;
                uVar13 = (ulong)*puVar7;
                if (*(char *)((long)pvVar6 + uVar13) != '\"') goto LAB_0015afdc;
                if (*(char *)((long)pvVar6 + (ulong)puVar7[1]) != ':') goto LAB_0015afbd;
                if ((*(char *)((long)pvVar6 + uVar13 + 9) == '\"') &&
                   (*(long *)((long)pvVar6 + uVar13 + 1) == 0x644974656b72616d)) break;
                puVar19 = puVar7 + 3;
                uVar5 = *(byte *)((long)pvVar6 + (ulong)puVar7[2]) - 0x2c;
                if (((uVar5 < 0x30) && ((0x800000004001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
                   (iVar4 = 2, *(byte *)((long)pvVar6 + (ulong)puVar7[2]) == 0x7b)) {
                  if (puVar19 < (uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2])) {
                    iVar21 = 3;
                    do {
                      uVar5 = *puVar19;
                      puVar19 = puVar19 + 1;
                      bVar3 = *(byte *)((long)pvVar6 + (ulong)uVar5);
                      if (bVar3 < 0x7b) {
                        if (bVar3 == 0x5b) {
LAB_00158c75:
                          iVar21 = iVar21 + 1;
                        }
                        else if (bVar3 == 0x5d) goto LAB_00158c7b;
                      }
                      else {
                        if (bVar3 != 0x7d) {
                          if (bVar3 != 0x7b) goto LAB_00158c83;
                          goto LAB_00158c75;
                        }
LAB_00158c7b:
                        iVar4 = iVar21 + -1;
                        bVar28 = iVar21 < 4;
                        iVar21 = iVar4;
                        if (bVar28) goto LAB_00158c9a;
                      }
LAB_00158c83:
                      if ((uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2]) <= puVar19)
                      break;
                    } while( true );
                  }
                  goto LAB_0015a6bb;
                }
LAB_00158c9a:
                if (puVar19 == puVar8) goto LAB_0015a6c0;
                if (puVar19 <= puVar20) goto LAB_0015b003;
                if (iVar4 != 2) goto LAB_0015b022;
                bVar28 = true;
                cVar14 = '\x02';
                if (*(char *)((long)pvVar6 + (ulong)*puVar19) != ',') {
                  if (*(char *)((long)pvVar6 + (ulong)*puVar19) != '}') goto LAB_0015b047;
                  cVar14 = '\x01';
                  bVar28 = false;
                }
                puVar7 = puVar19 + 1;
                if (!bVar28) goto LAB_0015af7d;
              }
LAB_00158ce7:
              puVar8 = puVar7 + 2;
              if (puVar20 < puVar8) {
                if (*(char *)((long)pvVar6 + (ulong)*puVar8) == '\"') {
                  puVar19 = puVar7 + 3;
                  pbVar17 = (byte *)((long)pvVar6 + (ulong)*puVar8 + 1);
                  pbVar25 = pbVar26;
                  do {
                    bVar3 = *pbVar17;
                    *pbVar25 = bVar3;
                    if (bVar3 == 0x5c) {
                      if ((ulong)pbVar17[1] != 0x75) {
                        if (simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                            [pbVar17[1]] != 0) {
                          *pbVar25 = simdjson::fallback::(anonymous_namespace)::stringparsing::
                                     escape_map[pbVar17[1]];
                          pbVar15 = pbVar17 + 2;
                          goto LAB_00158e21;
                        }
LAB_0015a776:
                        uVar16 = 5;
                        goto LAB_0015a6c0;
                      }
                      uVar5 = *(uint *)(simdjson::internal::digit_to_val32 +
                                       (ulong)pbVar17[3] * 4 + 0x690) |
                              *(uint *)(simdjson::internal::digit_to_val32 +
                                       (ulong)pbVar17[2] * 4 + 0x9d8) |
                              *(uint *)(simdjson::internal::digit_to_val32 +
                                       (ulong)pbVar17[4] * 4 + 0x348) |
                              *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar17[5] * 4);
                      pbVar15 = pbVar17 + 6;
                      if ((uVar5 & 0xfffffc00) == 0xd800) {
                        uVar16 = 5;
                        if (((*pbVar15 != 0x5c) || (pbVar17[7] != 0x75)) ||
                           (uVar22 = *(uint *)(simdjson::internal::digit_to_val32 +
                                              (ulong)pbVar17[9] * 4 + 0x690) |
                                     *(uint *)(simdjson::internal::digit_to_val32 +
                                              (ulong)pbVar17[8] * 4 + 0x9d8) |
                                     *(uint *)(simdjson::internal::digit_to_val32 +
                                              (ulong)pbVar17[10] * 4 + 0x348) |
                                     *(uint *)(simdjson::internal::digit_to_val32 +
                                              (ulong)pbVar17[0xb] * 4), 0xffff < uVar22))
                        goto LAB_0015a6c0;
                        uVar5 = (uVar22 - 0xdc00 | uVar5 * 0x400 + 0xfca00000) + 0x10000;
                        pbVar15 = pbVar17 + 0xc;
                      }
                      bVar3 = (byte)uVar5;
                      if (uVar5 < 0x80) {
                        *pbVar25 = bVar3;
                        lVar9 = 1;
                      }
                      else if (uVar5 < 0x800) {
                        *pbVar25 = (byte)(uVar5 >> 6) | 0xc0;
                        pbVar25[1] = bVar3 & 0x3f | 0x80;
                        lVar9 = 2;
                      }
                      else if (uVar5 < 0x10000) {
                        *pbVar25 = (byte)(uVar5 >> 0xc) | 0xe0;
                        pbVar25[1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
                        pbVar25[2] = bVar3 & 0x3f | 0x80;
                        lVar9 = 3;
                      }
                      else {
                        if (0x10ffff < uVar5) goto LAB_0015a776;
                        *pbVar25 = (byte)(uVar5 >> 0x12) | 0xf0;
                        pbVar25[1] = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
                        pbVar25[2] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
                        pbVar25[3] = bVar3 & 0x3f | 0x80;
                        lVar9 = 4;
                      }
                    }
                    else {
                      if (bVar3 == 0x22) goto LAB_00158ed4;
                      pbVar15 = pbVar17 + 1;
LAB_00158e21:
                      lVar9 = 1;
                    }
                    pbVar25 = pbVar25 + lVar9;
                    pbVar17 = pbVar15;
                  } while( true );
                }
                uVar16 = 0x10;
                goto LAB_0015a6c0;
              }
              goto LAB_0015b0e9;
            }
            goto LAB_0015af7d;
          }
          iVar4 = 0x10;
        }
        goto LAB_0015a7a2;
      }
LAB_00158772:
      if (pvStack_7c8 != (void *)0x0) {
        operator_delete__(pvStack_7c8);
      }
      pvStack_7c8 = (void *)0x0;
      if (local_7d0 != (byte *)0x0) {
        operator_delete__(local_7d0);
      }
      local_7d0 = (byte *)0x0;
      if (local_7f0 != (long *)0x0) {
        (**(code **)(*local_7f0 + 0x38))();
      }
      if (pvVar6 != (void *)0x0) {
        operator_delete__(pvVar6);
      }
      Client<hedg::Rest_Client>::~Client((Client<hedg::Rest_Client> *)&e);
      boost::asio::ssl::context::~context(&context);
      psVar23 = (service.super_execution_context.service_registry_)->first_service_;
      if (psVar23 == (service *)0x0) {
LAB_0015882b:
        eVar18.service_registry_ = service.super_execution_context.service_registry_;
        pthread_mutex_destroy
                  ((pthread_mutex_t *)&(service.super_execution_context.service_registry_)->mutex_);
      }
      else {
        do {
          (*psVar23->_vptr_service[2])(psVar23);
          eVar18 = service.super_execution_context;
          psVar23 = psVar23->next_;
        } while (psVar23 != (service *)0x0);
        psVar23 = (service.super_execution_context.service_registry_)->first_service_;
        if (psVar23 == (service *)0x0) goto LAB_0015882b;
        do {
          ppp_Var2 = &psVar23->_vptr_service;
          psVar23 = psVar23->next_;
          (*(*ppp_Var2)[1])();
          (eVar18.service_registry_)->first_service_ = psVar23;
        } while (psVar23 != (service *)0x0);
        if (service.super_execution_context.service_registry_ != (service_registry *)0x0)
        goto LAB_0015882b;
        eVar18.service_registry_ = (service_registry *)0x0;
      }
      operator_delete(eVar18.service_registry_,0x40);
      __mutex = local_7b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end_time._M_dataplus._M_p != &end_time.field_2) {
        operator_delete(end_time._M_dataplus._M_p,end_time.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)start_time._M_dataplus._M_p != &start_time.field_2) {
        operator_delete(start_time._M_dataplus._M_p,start_time.field_2._M_allocated_capacity + 1);
      }
      pthread_mutex_unlock(__mutex);
      std::condition_variable::notify_all();
      uVar5 = this->time_span_;
      tVar12 = this->time_unit_;
      in_RCX = (ulong)tVar12;
      if (tVar12 == mins) {
        uVar5 = uVar5 * 0x3c;
      }
      else if (tVar12 == hours) {
        uVar5 = uVar5 * 0xe10;
      }
      if (0 < (int)uVar5) {
        e._0_8_ = ZEXT48(uVar5);
        e._8_8_ = 0;
        do {
          iVar4 = nanosleep((timespec *)&e,(timespec *)&e);
          if (iVar4 != -1) break;
          piVar11 = __errno_location();
        } while (*piVar11 == 4);
      }
      iVar4 = pthread_mutex_lock(__mutex);
    } while (iVar4 == 0);
  }
  std::__throw_system_error(iVar4);
LAB_00159406:
  m_tm._M_dataplus._M_p = (pointer)&m_tm.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&m_tm,pbVar25,pbVar17);
  if (puVar8 <= local_7b0) goto LAB_0015b0c8;
  if (puVar7 == local_7b0) {
    bVar28 = true;
    iVar4 = 2;
    bVar29 = true;
    puVar7 = puVar8;
    puVar8 = puVar27;
  }
  else {
    if (puVar8 <= local_7b0) {
LAB_0015b003:
      __assert_fail("_json_iter->token._position > _start_position",
                    "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                    ,0x6767,
                    "void simdjson::fallback::ondemand::value_iterator::assert_at_next() const");
    }
    if (*(char *)((long)pvVar6 + (ulong)puVar20[3]) == ',') {
      bVar28 = true;
      iVar4 = 2;
    }
    else {
      if (*(char *)((long)pvVar6 + (ulong)puVar20[3]) != '}') {
LAB_0015a6f2:
        uVar16 = 3;
        goto LAB_0015a6f8;
      }
      iVar4 = 1;
      bVar28 = false;
    }
    if (*(uint **)((long)pvStack_7c8 + 0x10) != local_7b0) {
      uVar16 = 0x19;
      goto LAB_0015a6f8;
    }
    bVar29 = false;
    puVar7 = puVar20 + 4;
  }
  if (bVar28) {
    do {
      if (iVar4 != 2) goto LAB_0015af16;
      if (puVar7 <= local_7b0) goto LAB_0015b003;
      uVar13 = (ulong)*puVar7;
      uVar16 = 3;
      if ((*(char *)((long)pvVar6 + uVar13) != '\"') ||
         (*(char *)((long)pvVar6 + (ulong)puVar7[1]) != ':')) goto LAB_0015a6f8;
      if ((*(char *)((long)pvVar6 + uVar13 + 10) == '\"') &&
         (*(char *)((long)pvVar6 + uVar13 + 9) == 'e' &&
          *(long *)((long)pvVar6 + uVar13 + 1) == 0x707954746e657665)) goto LAB_0015974d;
      puVar20 = puVar7 + 3;
      uVar5 = *(byte *)((long)pvVar6 + (ulong)puVar7[2]) - 0x2c;
      if (((uVar5 < 0x30) && ((0x800000004001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
         (iVar4 = 2, *(byte *)((long)pvVar6 + (ulong)puVar7[2]) == 0x7b)) {
        if (puVar20 < (uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2])) {
          iVar21 = 3;
          do {
            uVar5 = *puVar20;
            puVar20 = puVar20 + 1;
            bVar3 = *(byte *)((long)pvVar6 + (ulong)uVar5);
            if (bVar3 < 0x7b) {
              if (bVar3 == 0x5b) {
LAB_00159573:
                iVar21 = iVar21 + 1;
              }
              else if (bVar3 == 0x5d) goto LAB_00159579;
            }
            else {
              if (bVar3 != 0x7d) {
                if (bVar3 != 0x7b) goto LAB_00159581;
                goto LAB_00159573;
              }
LAB_00159579:
              iVar4 = iVar21 + -1;
              bVar28 = iVar21 < 4;
              iVar21 = iVar4;
              if (bVar28) goto LAB_00159598;
            }
LAB_00159581:
            if ((uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2]) <= puVar20)
            goto LAB_0015a6f2;
          } while( true );
        }
        goto LAB_0015a6f8;
      }
LAB_00159598:
      if (puVar20 <= local_7b0) goto LAB_0015b003;
      if (iVar4 != 2) goto LAB_0015b022;
      bVar28 = true;
      iVar4 = 2;
      if (*(char *)((long)pvVar6 + (ulong)*puVar20) != ',') {
        if (*(char *)((long)pvVar6 + (ulong)*puVar20) != '}') goto LAB_0015a6f8;
        iVar4 = 1;
        bVar28 = false;
      }
      puVar7 = puVar20 + 1;
    } while (bVar28);
  }
  uVar16 = 0x13;
  if (bVar29) goto LAB_0015a6f8;
  *(uint **)((long)pvStack_7c8 + 0x10) = local_7b0;
  bVar28 = *(char *)((long)pvVar6 + (ulong)local_7b0[1]) != '}';
  if (bVar28) {
    cVar14 = bVar28 + '\x01';
    puVar7 = puVar27;
    while( true ) {
      if (cVar14 != '\x02') goto LAB_0015af9e;
      if (puVar7 <= local_7b0) goto LAB_0015b003;
      uVar13 = (ulong)*puVar7;
      if (*(char *)((long)pvVar6 + uVar13) != '\"') goto LAB_0015afdc;
      if (*(char *)((long)pvVar6 + (ulong)puVar7[1]) != ':') goto LAB_0015afbd;
      if ((*(char *)((long)pvVar6 + uVar13 + 10) == '\"') &&
         (*(char *)((long)pvVar6 + uVar13 + 9) == 'e' &&
          *(long *)((long)pvVar6 + uVar13 + 1) == 0x707954746e657665)) break;
      puVar20 = puVar7 + 3;
      uVar5 = *(byte *)((long)pvVar6 + (ulong)puVar7[2]) - 0x2c;
      if (((uVar5 < 0x30) && ((0x800000004001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
         (iVar4 = 2, *(byte *)((long)pvVar6 + (ulong)puVar7[2]) == 0x7b)) {
        if (puVar20 < (uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2])) {
          iVar21 = 3;
          do {
            uVar5 = *puVar20;
            puVar20 = puVar20 + 1;
            bVar3 = *(byte *)((long)pvVar6 + (ulong)uVar5);
            if (bVar3 < 0x7b) {
              if (bVar3 == 0x5b) {
LAB_001596dd:
                iVar21 = iVar21 + 1;
              }
              else if (bVar3 == 0x5d) goto LAB_001596e3;
            }
            else {
              if (bVar3 != 0x7d) {
                if (bVar3 != 0x7b) goto LAB_001596eb;
                goto LAB_001596dd;
              }
LAB_001596e3:
              iVar4 = iVar21 + -1;
              bVar28 = iVar21 < 4;
              iVar21 = iVar4;
              if (bVar28) goto LAB_00159702;
            }
LAB_001596eb:
            if ((uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2]) <= puVar20) break;
          } while( true );
        }
        goto LAB_0015a6f2;
      }
LAB_00159702:
      if (puVar20 == puVar8) goto LAB_0015a6f8;
      if (puVar20 <= local_7b0) goto LAB_0015b003;
      if (iVar4 != 2) goto LAB_0015b022;
      bVar28 = true;
      cVar14 = '\x02';
      if (*(char *)((long)pvVar6 + (ulong)*puVar20) != ',') {
        if (*(char *)((long)pvVar6 + (ulong)*puVar20) != '}') goto LAB_0015b047;
        cVar14 = '\x01';
        bVar28 = false;
      }
      puVar7 = puVar20 + 1;
      if (!bVar28) goto LAB_0015af7d;
    }
LAB_0015974d:
    puVar20 = puVar7 + 2;
    if (local_7b0 < puVar20) {
      uVar16 = 0x10;
      if (*(char *)((long)pvVar6 + (ulong)*puVar20) == '{') {
        *(uint **)((long)pvStack_7c8 + 0x18) = puVar20;
        bVar28 = true;
        bVar29 = *(char *)((long)pvVar6 + (ulong)puVar7[3]) == '}';
        if (bVar29) {
          *(uint **)((long)pvStack_7c8 + 0x18) = puVar20;
          if (*(char *)((long)pvVar6 + (ulong)puVar7[3]) == '}') {
            puVar7 = puVar7 + 4;
            bVar3 = 2;
            bVar28 = false;
          }
          else {
            puVar7 = puVar7 + 3;
            bVar3 = 3;
          }
        }
        else {
          bVar3 = bVar29 ^ 3;
          puVar7 = puVar20 + (ulong)bVar29 + 1;
        }
        while( true ) {
          if (!bVar28) {
            uVar16 = 0x13;
            goto LAB_0015a6f8;
          }
          if (bVar3 != 3) goto LAB_0015af16;
          if (puVar7 <= puVar20) goto LAB_0015b003;
          uVar13 = (ulong)*puVar7;
          uVar16 = 3;
          if ((*(char *)((long)pvVar6 + uVar13) != '\"') ||
             (*(char *)((long)pvVar6 + (ulong)puVar7[1]) != ':')) goto LAB_0015a6f8;
          if ((*(char *)((long)pvVar6 + uVar13 + 3) == '\"') &&
             (*(short *)((long)pvVar6 + uVar13 + 1) == 0x6469)) break;
          puVar8 = puVar7 + 3;
          uVar5 = *(byte *)((long)pvVar6 + (ulong)puVar7[2]) - 0x2c;
          if (((uVar5 < 0x30) && ((0x800000004001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
             (iVar4 = 3, *(byte *)((long)pvVar6 + (ulong)puVar7[2]) == 0x7b)) {
            if (puVar8 < (uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2])) {
              iVar21 = 4;
              do {
                uVar5 = *puVar8;
                puVar8 = puVar8 + 1;
                bVar3 = *(byte *)((long)pvVar6 + (ulong)uVar5);
                if (bVar3 < 0x7b) {
                  if (bVar3 == 0x5b) {
LAB_00159890:
                    iVar21 = iVar21 + 1;
                  }
                  else if (bVar3 == 0x5d) goto LAB_00159896;
                }
                else {
                  if (bVar3 != 0x7d) {
                    if (bVar3 != 0x7b) goto LAB_0015989e;
                    goto LAB_00159890;
                  }
LAB_00159896:
                  iVar4 = iVar21 + -1;
                  bVar28 = iVar21 < 5;
                  iVar21 = iVar4;
                  if (bVar28) goto LAB_001598b5;
                }
LAB_0015989e:
                if ((uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2]) <= puVar8) break;
              } while( true );
            }
            goto LAB_0015a6f8;
          }
LAB_001598b5:
          if (puVar8 <= puVar20) goto LAB_0015b003;
          if (iVar4 != 3) goto LAB_0015b022;
          bVar28 = true;
          bVar3 = 3;
          if (*(char *)((long)pvVar6 + (ulong)*puVar8) != ',') {
            if (*(char *)((long)pvVar6 + (ulong)*puVar8) != '}') goto LAB_0015a6f2;
            bVar3 = 2;
            bVar28 = false;
          }
          puVar7 = puVar8 + 1;
        }
        puVar8 = puVar7 + 2;
        if (puVar8 <= puVar20) goto LAB_0015b0e9;
        uVar16 = 0x10;
        if (*(char *)((long)pvVar6 + (ulong)*puVar8) == '\"') {
          puVar20 = puVar7 + 3;
          pbVar25 = pbVar17;
          pbVar26 = (byte *)((long)pvVar6 + (ulong)*puVar8 + 1);
          do {
            bVar3 = *pbVar26;
            *pbVar25 = bVar3;
            if (bVar3 == 0x5c) {
              if ((ulong)pbVar26[1] != 0x75) {
                if (simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map[pbVar26[1]]
                    != 0) {
                  *pbVar25 = simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                             [pbVar26[1]];
                  pbVar15 = pbVar26 + 2;
                  goto LAB_00159a3f;
                }
LAB_0015a788:
                uVar16 = 5;
                break;
              }
              uVar5 = *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar26[3] * 4 + 0x690)
                      | *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar26[2] * 4 + 0x9d8
                                 ) |
                      *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar26[4] * 4 + 0x348)
                      | *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar26[5] * 4);
              pbVar15 = pbVar26 + 6;
              if ((uVar5 & 0xfffffc00) == 0xd800) {
                uVar16 = 5;
                if (((*pbVar15 != 0x5c) || (pbVar26[7] != 0x75)) ||
                   (uVar22 = *(uint *)(simdjson::internal::digit_to_val32 +
                                      (ulong)pbVar26[9] * 4 + 0x690) |
                             *(uint *)(simdjson::internal::digit_to_val32 +
                                      (ulong)pbVar26[8] * 4 + 0x9d8) |
                             *(uint *)(simdjson::internal::digit_to_val32 +
                                      (ulong)pbVar26[10] * 4 + 0x348) |
                             *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar26[0xb] * 4)
                   , 0xffff < uVar22)) break;
                uVar5 = (uVar22 - 0xdc00 | uVar5 * 0x400 + 0xfca00000) + 0x10000;
                pbVar15 = pbVar26 + 0xc;
              }
              bVar3 = (byte)uVar5;
              if (uVar5 < 0x80) {
                *pbVar25 = bVar3;
                lVar9 = 1;
              }
              else if (uVar5 < 0x800) {
                *pbVar25 = (byte)(uVar5 >> 6) | 0xc0;
                pbVar25[1] = bVar3 & 0x3f | 0x80;
                lVar9 = 2;
              }
              else if (uVar5 < 0x10000) {
                *pbVar25 = (byte)(uVar5 >> 0xc) | 0xe0;
                pbVar25[1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
                pbVar25[2] = bVar3 & 0x3f | 0x80;
                lVar9 = 3;
              }
              else {
                if (0x10ffff < uVar5) goto LAB_0015a788;
                *pbVar25 = (byte)(uVar5 >> 0x12) | 0xf0;
                pbVar25[1] = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
                pbVar25[2] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
                pbVar25[3] = bVar3 & 0x3f | 0x80;
                lVar9 = 4;
              }
            }
            else {
              if (bVar3 == 0x22) goto LAB_00159aef;
              pbVar15 = pbVar26 + 1;
LAB_00159a3f:
              lVar9 = 1;
            }
            pbVar25 = pbVar25 + lVar9;
            pbVar26 = pbVar15;
          } while( true );
        }
      }
LAB_0015a6f8:
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar10 = &PTR__exception_001eae70;
      *(undefined4 *)(puVar10 + 1) = uVar16;
      __cxa_throw(puVar10,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
    }
LAB_0015b0e9:
    __assert_fail("_json_iter->token._position > _start_position",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x6781,
                  "void simdjson::fallback::ondemand::value_iterator::assert_at_child() const");
  }
  goto LAB_0015af7d;
LAB_00159ed0:
  puVar27 = puVar20 + 2;
  if (local_7b0 < puVar27) {
    uVar16 = 0x10;
    if (*(char *)((long)pvVar6 + (ulong)*puVar27) == '{') {
      *(uint **)((long)pvStack_7c8 + 0x18) = puVar27;
      bVar28 = true;
      bVar29 = *(char *)((long)pvVar6 + (ulong)puVar20[3]) == '}';
      if (bVar29) {
        *(uint **)((long)pvStack_7c8 + 0x18) = puVar27;
        if (*(char *)((long)pvVar6 + (ulong)puVar20[3]) == '}') {
          puVar20 = puVar20 + 4;
          bVar3 = 2;
          bVar28 = false;
        }
        else {
          puVar20 = puVar20 + 3;
          bVar3 = 3;
        }
      }
      else {
        bVar3 = bVar29 ^ 3;
        puVar20 = puVar27 + (ulong)bVar29 + 1;
      }
      if (bVar28) {
        do {
          if (bVar3 != 3) {
LAB_0015af16:
            __assert_fail("_json_iter->_depth == _depth",
                          "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                          ,0x6534,
                          "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                         );
          }
          if (puVar20 <= puVar27) goto LAB_0015b003;
          uVar13 = (ulong)*puVar20;
          uVar16 = 3;
          if ((*(char *)((long)pvVar6 + uVar13) != '\"') ||
             (*(char *)((long)pvVar6 + (ulong)puVar20[1]) != ':')) goto LAB_0015a689;
          if ((*(char *)((long)pvVar6 + uVar13 + 0xc) == '\"') &&
             (*(long *)((long)pvVar6 + uVar13 + 4) == 0x65646f437972746e &&
              *(long *)((long)pvVar6 + uVar13 + 1) == 0x437972746e756f63)) goto LAB_0015a091;
          puVar7 = puVar20 + 3;
          uVar5 = *(byte *)((long)pvVar6 + (ulong)puVar20[2]) - 0x2c;
          if (((uVar5 < 0x30) && ((0x800000004001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
             (iVar4 = 3, *(byte *)((long)pvVar6 + (ulong)puVar20[2]) == 0x7b)) {
            if (puVar7 < (uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2])) {
              iVar21 = 4;
              do {
                uVar5 = *puVar7;
                puVar7 = puVar7 + 1;
                bVar3 = *(byte *)((long)pvVar6 + (ulong)uVar5);
                if (bVar3 < 0x7b) {
                  if (bVar3 == 0x5b) {
LAB_0015a02a:
                    iVar21 = iVar21 + 1;
                  }
                  else if (bVar3 == 0x5d) goto LAB_0015a030;
                }
                else {
                  if (bVar3 != 0x7d) {
                    if (bVar3 != 0x7b) goto LAB_0015a038;
                    goto LAB_0015a02a;
                  }
LAB_0015a030:
                  iVar4 = iVar21 + -1;
                  bVar28 = iVar21 < 5;
                  iVar21 = iVar4;
                  if (bVar28) goto LAB_0015a04f;
                }
LAB_0015a038:
                if ((uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2]) <= puVar7) break;
              } while( true );
            }
            goto LAB_0015a689;
          }
LAB_0015a04f:
          if (puVar7 <= puVar27) goto LAB_0015b003;
          if (iVar4 != 3) goto LAB_0015b022;
          bVar28 = true;
          bVar3 = 3;
          if (*(char *)((long)pvVar6 + (ulong)*puVar7) != ',') {
            if (*(char *)((long)pvVar6 + (ulong)*puVar7) != '}') goto LAB_0015a684;
            bVar3 = 2;
            bVar28 = false;
          }
          puVar20 = puVar7 + 1;
          if (!bVar28) break;
        } while( true );
      }
      uVar16 = 0x13;
    }
    goto LAB_0015a689;
  }
  goto LAB_0015b0e9;
LAB_0015a091:
  if (puVar20 + 2 <= puVar27) goto LAB_0015b0e9;
  uVar13 = (ulong)puVar20[2];
  uVar16 = 0x10;
  if (*(char *)((long)pvVar6 + uVar13) == '\"') {
    pbVar17 = (byte *)((long)pvVar6 + uVar13 + 1);
    pbVar26 = pbVar25;
    do {
      bVar3 = *pbVar17;
      *pbVar26 = bVar3;
      if (bVar3 == 0x5c) {
        if ((ulong)pbVar17[1] != 0x75) {
          if (simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map[pbVar17[1]] != 0)
          {
            *pbVar26 = simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                       [pbVar17[1]];
            pbVar15 = pbVar17 + 2;
            goto LAB_0015a1d0;
          }
LAB_0015a793:
          uVar16 = 5;
          break;
        }
        uVar5 = *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar17[3] * 4 + 0x690) |
                *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar17[2] * 4 + 0x9d8) |
                *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar17[4] * 4 + 0x348) |
                *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar17[5] * 4);
        pbVar15 = pbVar17 + 6;
        if ((uVar5 & 0xfffffc00) == 0xd800) {
          uVar16 = 5;
          if (((*pbVar15 != 0x5c) || (pbVar17[7] != 0x75)) ||
             (uVar22 = *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar17[9] * 4 + 0x690)
                       | *(uint *)(simdjson::internal::digit_to_val32 +
                                  (ulong)pbVar17[8] * 4 + 0x9d8) |
                       *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar17[10] * 4 + 0x348
                                ) |
                       *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar17[0xb] * 4),
             0xffff < uVar22)) break;
          uVar5 = (uVar22 - 0xdc00 | uVar5 * 0x400 + 0xfca00000) + 0x10000;
          pbVar15 = pbVar17 + 0xc;
        }
        bVar3 = (byte)uVar5;
        if (uVar5 < 0x80) {
          *pbVar26 = bVar3;
          lVar9 = 1;
        }
        else if (uVar5 < 0x800) {
          *pbVar26 = (byte)(uVar5 >> 6) | 0xc0;
          pbVar26[1] = bVar3 & 0x3f | 0x80;
          lVar9 = 2;
        }
        else if (uVar5 < 0x10000) {
          *pbVar26 = (byte)(uVar5 >> 0xc) | 0xe0;
          pbVar26[1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
          pbVar26[2] = bVar3 & 0x3f | 0x80;
          lVar9 = 3;
        }
        else {
          if (0x10ffff < uVar5) goto LAB_0015a793;
          *pbVar26 = (byte)(uVar5 >> 0x12) | 0xf0;
          pbVar26[1] = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
          pbVar26[2] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
          pbVar26[3] = bVar3 & 0x3f | 0x80;
          lVar9 = 4;
        }
      }
      else {
        if (bVar3 == 0x22) goto LAB_0015a27d;
        pbVar15 = pbVar17 + 1;
LAB_0015a1d0:
        lVar9 = 1;
      }
      pbVar26 = pbVar26 + lVar9;
      pbVar17 = pbVar15;
    } while( true );
  }
  goto LAB_0015a689;
LAB_0015a27d:
  country_code._M_dataplus._M_p = (pointer)&country_code.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&country_code,pbVar25,pbVar26);
  local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_710,m_tm._M_dataplus._M_p,
             m_tm._M_dataplus._M_p + m_tm._M_string_length);
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_730,event_type._M_dataplus._M_p,
             event_type._M_dataplus._M_p + event_type._M_string_length);
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5d0,country_code._M_dataplus._M_p,
             country_code._M_dataplus._M_p + country_code._M_string_length);
  Market_Projection::Market_Projection(&local_538,&local_710,&local_730,&local_5d0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_hedg::Market_Projection,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
              *)local_4d8,&m_id,&local_538);
  std::
  deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>
  ::emplace_back<std::pair<std::__cxx11::string,hedg::Market_Projection>>
            ((deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>
              *)&this->markets_,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
              *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_p != &local_468) {
    operator_delete(local_478._M_p,local_468._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_p != &local_488) {
    operator_delete(local_498._M_p,(ulong)(local_488._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._32_8_ != &local_4a8) {
    operator_delete((void *)local_4d8._32_8_,local_4a8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
    operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.country_code_._M_dataplus._M_p != &local_538.country_code_.field_2) {
    operator_delete(local_538.country_code_._M_dataplus._M_p,
                    local_538.country_code_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.event_type_._M_dataplus._M_p != &local_538.event_type_.field_2) {
    operator_delete(local_538.event_type_._M_dataplus._M_p,
                    local_538.event_type_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.market_start_time_._M_dataplus._M_p != &local_538.market_start_time_.field_2) {
    operator_delete(local_538.market_start_time_._M_dataplus._M_p,
                    local_538.market_start_time_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)country_code._M_dataplus._M_p != &country_code.field_2) {
    operator_delete(country_code._M_dataplus._M_p,country_code.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)event_type._M_dataplus._M_p != &event_type.field_2) {
    operator_delete(event_type._M_dataplus._M_p,event_type.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)m_tm._M_dataplus._M_p != &m_tm.field_2) {
    operator_delete(m_tm._M_dataplus._M_p,m_tm.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)m_id._M_dataplus._M_p != &m_id.field_2) {
    operator_delete(m_id._M_dataplus._M_p,m_id.field_2._M_allocated_capacity + 1);
  }
  if (puVar20 + 3 <= puVar1) {
    __assert_fail("_json_iter->token._position > _start_position",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x66b7,"error_code simdjson::fallback::ondemand::value_iterator::skip_child()");
  }
  bVar3 = *(byte *)((long)pvVar6 + (ulong)puVar20[3]);
  iVar21 = 3;
  if (bVar3 < 0x5d) {
    if ((bVar3 == 0x2c) || ((bVar3 == 0x3a || (bVar3 == 0x5b)))) goto LAB_0015a5b6;
  }
  else if ((bVar3 != 0x7d) && (bVar3 == 0x7b)) goto LAB_0015a5b6;
  iVar21 = 2;
LAB_0015a5b6:
  puVar20 = puVar20 + 4;
  puVar27 = puVar20;
  iVar4 = iVar21;
  if (puVar20 < (uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2])) {
    do {
      puVar20 = puVar27 + 1;
      bVar3 = *(byte *)((long)pvVar6 + (ulong)*puVar27);
      if (bVar3 < 0x7b) {
        if (bVar3 == 0x5b) {
LAB_0015a600:
          iVar21 = iVar4 + 1;
          iVar4 = iVar21;
        }
        else if (bVar3 == 0x5d) goto LAB_0015a606;
      }
      else {
        if (bVar3 != 0x7d) {
          if (bVar3 != 0x7b) goto LAB_0015a610;
          goto LAB_0015a600;
        }
LAB_0015a606:
        iVar21 = iVar4 + -1;
        bVar28 = iVar4 < 3;
        iVar4 = iVar21;
        if (bVar28) {
          if (puVar20 <= puVar1) goto LAB_0015b003;
          if (iVar21 != 1) goto LAB_0015b022;
          puVar20 = puVar27 + 2;
          iVar4 = local_7bc;
          if (*(char *)((long)pvVar6 + (ulong)puVar27[1]) == ',') {
            iVar21 = 2;
          }
          else if (*(char *)((long)pvVar6 + (ulong)puVar27[1]) == ']') {
            iVar21 = 0;
          }
          else {
            iVar4 = 3;
          }
          goto LAB_0015a628;
        }
      }
LAB_0015a610:
      puVar27 = puVar20;
    } while (puVar20 < (uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2]));
  }
  iVar4 = 3;
LAB_0015a628:
  if (iVar21 < 1) goto LAB_00158772;
  goto LAB_001588a8;
LAB_00158ed4:
  m_id._M_dataplus._M_p = (pointer)&m_id.field_2;
  local_7b0 = puVar20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&m_id,pbVar26,pbVar25);
  if (puVar19 <= local_7b0) goto LAB_0015b0c8;
  if (puVar8 == local_7b0) {
    bVar28 = true;
    iVar4 = 2;
    bVar29 = true;
    puVar20 = puVar19;
    puVar19 = puVar27;
  }
  else {
    if (puVar19 <= local_7b0) goto LAB_0015b003;
    if (*(char *)((long)pvVar6 + (ulong)puVar7[3]) == ',') {
      bVar28 = true;
      iVar4 = 2;
    }
    else {
      if (*(char *)((long)pvVar6 + (ulong)puVar7[3]) != '}') {
LAB_0015a72b:
        uVar16 = 3;
        goto LAB_0015a731;
      }
      iVar4 = 1;
      bVar28 = false;
    }
    if (*(uint **)((long)pvStack_7c8 + 0x10) != local_7b0) {
      uVar16 = 0x19;
      goto LAB_0015a731;
    }
    bVar29 = false;
    puVar20 = puVar7 + 4;
  }
  if (bVar28) {
    do {
      if (iVar4 != 2) goto LAB_0015af16;
      if (puVar20 <= local_7b0) goto LAB_0015b003;
      uVar13 = (ulong)*puVar20;
      uVar16 = 3;
      if ((*(char *)((long)pvVar6 + uVar13) != '\"') ||
         (*(char *)((long)pvVar6 + (ulong)puVar20[1]) != ':')) goto LAB_0015a731;
      if ((*(char *)((long)pvVar6 + uVar13 + 0x10) == '\"') &&
         (*(long *)((long)pvVar6 + uVar13 + 8) == 0x656d695474726174 &&
          *(long *)((long)pvVar6 + uVar13 + 1) == 0x745374656b72616d)) goto LAB_00159230;
      puVar7 = puVar20 + 3;
      uVar5 = *(byte *)((long)pvVar6 + (ulong)puVar20[2]) - 0x2c;
      if (((uVar5 < 0x30) && ((0x800000004001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
         (iVar4 = 2, *(byte *)((long)pvVar6 + (ulong)puVar20[2]) == 0x7b)) {
        if (puVar7 < (uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2])) {
          iVar21 = 3;
          do {
            uVar5 = *puVar7;
            puVar7 = puVar7 + 1;
            bVar3 = *(byte *)((long)pvVar6 + (ulong)uVar5);
            if (bVar3 < 0x7b) {
              if (bVar3 == 0x5b) {
LAB_0015904e:
                iVar21 = iVar21 + 1;
              }
              else if (bVar3 == 0x5d) goto LAB_00159054;
            }
            else {
              if (bVar3 != 0x7d) {
                if (bVar3 != 0x7b) goto LAB_0015905c;
                goto LAB_0015904e;
              }
LAB_00159054:
              iVar4 = iVar21 + -1;
              bVar28 = iVar21 < 4;
              iVar21 = iVar4;
              if (bVar28) goto LAB_00159073;
            }
LAB_0015905c:
            if ((uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2]) <= puVar7)
            goto LAB_0015a72b;
          } while( true );
        }
        goto LAB_0015a731;
      }
LAB_00159073:
      if (puVar7 <= local_7b0) goto LAB_0015b003;
      if (iVar4 != 2) goto LAB_0015b022;
      bVar28 = true;
      iVar4 = 2;
      if (*(char *)((long)pvVar6 + (ulong)*puVar7) != ',') {
        if (*(char *)((long)pvVar6 + (ulong)*puVar7) != '}') goto LAB_0015a731;
        iVar4 = 1;
        bVar28 = false;
      }
      puVar20 = puVar7 + 1;
    } while (bVar28);
  }
  uVar16 = 0x13;
  if (!bVar29) {
    *(uint **)((long)pvStack_7c8 + 0x10) = local_7b0;
    bVar28 = *(char *)((long)pvVar6 + (ulong)local_7b0[1]) != '}';
    if (!bVar28) goto LAB_0015af7d;
    cVar14 = bVar28 + '\x01';
    puVar20 = puVar27;
    while( true ) {
      if (cVar14 != '\x02') goto LAB_0015af9e;
      if (puVar20 <= local_7b0) goto LAB_0015b003;
      uVar13 = (ulong)*puVar20;
      if (*(char *)((long)pvVar6 + uVar13) != '\"') goto LAB_0015afdc;
      if (*(char *)((long)pvVar6 + (ulong)puVar20[1]) != ':') goto LAB_0015afbd;
      if ((*(char *)((long)pvVar6 + uVar13 + 0x10) == '\"') &&
         (*(long *)((long)pvVar6 + uVar13 + 8) == 0x656d695474726174 &&
          *(long *)((long)pvVar6 + uVar13 + 1) == 0x745374656b72616d)) break;
      puVar7 = puVar20 + 3;
      uVar5 = *(byte *)((long)pvVar6 + (ulong)puVar20[2]) - 0x2c;
      if (((uVar5 < 0x30) && ((0x800000004001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
         (iVar4 = 2, *(byte *)((long)pvVar6 + (ulong)puVar20[2]) == 0x7b)) {
        if (puVar7 < (uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2])) {
          iVar21 = 3;
          do {
            uVar5 = *puVar7;
            puVar7 = puVar7 + 1;
            bVar3 = *(byte *)((long)pvVar6 + (ulong)uVar5);
            if (bVar3 < 0x7b) {
              if (bVar3 == 0x5b) {
LAB_001591c0:
                iVar21 = iVar21 + 1;
              }
              else if (bVar3 == 0x5d) goto LAB_001591c6;
            }
            else {
              if (bVar3 != 0x7d) {
                if (bVar3 != 0x7b) goto LAB_001591ce;
                goto LAB_001591c0;
              }
LAB_001591c6:
              iVar4 = iVar21 + -1;
              bVar28 = iVar21 < 4;
              iVar21 = iVar4;
              if (bVar28) goto LAB_001591e5;
            }
LAB_001591ce:
            if ((uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2]) <= puVar7) break;
          } while( true );
        }
        goto LAB_0015a72b;
      }
LAB_001591e5:
      if (puVar7 == puVar19) goto LAB_0015a731;
      if (puVar7 <= local_7b0) goto LAB_0015b003;
      if (iVar4 != 2) goto LAB_0015b022;
      bVar28 = true;
      cVar14 = '\x02';
      if (*(char *)((long)pvVar6 + (ulong)*puVar7) != ',') {
        if (*(char *)((long)pvVar6 + (ulong)*puVar7) != '}') goto LAB_0015b047;
        cVar14 = '\x01';
        bVar28 = false;
      }
      puVar20 = puVar7 + 1;
      if (!bVar28) goto LAB_0015af7d;
    }
LAB_00159230:
    puVar7 = puVar20 + 2;
    if (puVar7 <= local_7b0) goto LAB_0015b0e9;
    if (*(char *)((long)pvVar6 + (ulong)*puVar7) == '\"') {
      puVar8 = puVar20 + 3;
      pbVar26 = (byte *)((long)pvVar6 + (ulong)*puVar7 + 1);
      pbVar17 = pbVar25;
      do {
        bVar3 = *pbVar26;
        *pbVar17 = bVar3;
        if (bVar3 == 0x5c) {
          if ((ulong)pbVar26[1] != 0x75) {
            if (simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map[pbVar26[1]] !=
                0) {
              *pbVar17 = simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                         [pbVar26[1]];
              pbVar15 = pbVar26 + 2;
              goto LAB_00159365;
            }
LAB_0015a780:
            uVar16 = 5;
            goto LAB_0015a731;
          }
          uVar5 = *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar26[3] * 4 + 0x690) |
                  *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar26[2] * 4 + 0x9d8) |
                  *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar26[4] * 4 + 0x348) |
                  *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar26[5] * 4);
          pbVar15 = pbVar26 + 6;
          if ((uVar5 & 0xfffffc00) == 0xd800) {
            uVar16 = 5;
            if (((*pbVar15 != 0x5c) || (pbVar26[7] != 0x75)) ||
               (uVar22 = *(uint *)(simdjson::internal::digit_to_val32 +
                                  (ulong)pbVar26[9] * 4 + 0x690) |
                         *(uint *)(simdjson::internal::digit_to_val32 +
                                  (ulong)pbVar26[8] * 4 + 0x9d8) |
                         *(uint *)(simdjson::internal::digit_to_val32 +
                                  (ulong)pbVar26[10] * 4 + 0x348) |
                         *(uint *)(simdjson::internal::digit_to_val32 + (ulong)pbVar26[0xb] * 4),
               0xffff < uVar22)) goto LAB_0015a731;
            uVar5 = (uVar22 - 0xdc00 | uVar5 * 0x400 + 0xfca00000) + 0x10000;
            pbVar15 = pbVar26 + 0xc;
          }
          bVar3 = (byte)uVar5;
          if (uVar5 < 0x80) {
            *pbVar17 = bVar3;
            lVar9 = 1;
          }
          else if (uVar5 < 0x800) {
            *pbVar17 = (byte)(uVar5 >> 6) | 0xc0;
            pbVar17[1] = bVar3 & 0x3f | 0x80;
            lVar9 = 2;
          }
          else if (uVar5 < 0x10000) {
            *pbVar17 = (byte)(uVar5 >> 0xc) | 0xe0;
            pbVar17[1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
            pbVar17[2] = bVar3 & 0x3f | 0x80;
            lVar9 = 3;
          }
          else {
            if (0x10ffff < uVar5) goto LAB_0015a780;
            *pbVar17 = (byte)(uVar5 >> 0x12) | 0xf0;
            pbVar17[1] = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
            pbVar17[2] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
            pbVar17[3] = bVar3 & 0x3f | 0x80;
            lVar9 = 4;
          }
        }
        else {
          if (bVar3 == 0x22) goto LAB_00159406;
          pbVar15 = pbVar26 + 1;
LAB_00159365:
          lVar9 = 1;
        }
        pbVar17 = pbVar17 + lVar9;
        pbVar26 = pbVar15;
      } while( true );
    }
    uVar16 = 0x10;
  }
LAB_0015a731:
  puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar10 = &PTR__exception_001eae70;
  *(undefined4 *)(puVar10 + 1) = uVar16;
  __cxa_throw(puVar10,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
LAB_00159aef:
  event_type._M_dataplus._M_p = (pointer)&event_type.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&event_type,pbVar17);
  if (puVar20 <= local_7b0) {
LAB_0015b0c8:
    __assert_fail("_json_iter->token._position > _start_position",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x66d5,
                  "bool simdjson::fallback::ondemand::value_iterator::at_first_field() const");
  }
  if (puVar8 == local_7b0) {
    bVar29 = true;
    iVar4 = 3;
    bVar28 = true;
    puVar8 = puVar27;
  }
  else {
    puVar8 = puVar7 + 4;
    uVar5 = *(byte *)((long)pvVar6 + (ulong)puVar7[3]) - 0x2c;
    if (((uVar5 < 0x30) && ((0x800000004001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
       (iVar4 = 2, *(byte *)((long)pvVar6 + (ulong)puVar7[3]) == 0x7b)) {
      if (puVar8 < (uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2])) {
        iVar21 = 3;
        do {
          uVar5 = *puVar8;
          puVar8 = puVar8 + 1;
          bVar3 = *(byte *)((long)pvVar6 + (ulong)uVar5);
          if (bVar3 < 0x7b) {
            if (bVar3 == 0x5b) {
LAB_00159ba6:
              iVar21 = iVar21 + 1;
            }
            else if (bVar3 == 0x5d) goto LAB_00159bac;
          }
          else {
            if (bVar3 != 0x7d) {
              if (bVar3 != 0x7b) goto LAB_00159bb4;
              goto LAB_00159ba6;
            }
LAB_00159bac:
            iVar4 = iVar21 + -1;
            bVar28 = iVar21 < 4;
            iVar21 = iVar4;
            if (bVar28) goto LAB_00159bcb;
          }
LAB_00159bb4:
          if ((uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2]) <= puVar8) break;
        } while( true );
      }
LAB_0015a684:
      uVar16 = 3;
      goto LAB_0015a689;
    }
LAB_00159bcb:
    if (puVar8 <= local_7b0) goto LAB_0015b003;
    if (iVar4 != 2) {
LAB_0015b022:
      __assert_fail("_json_iter->_depth == _depth",
                    "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                    ,0x6768,
                    "void simdjson::fallback::ondemand::value_iterator::assert_at_next() const");
    }
    bVar29 = true;
    iVar4 = 2;
    if (*(char *)((long)pvVar6 + (ulong)*puVar8) != ',') {
      if (*(char *)((long)pvVar6 + (ulong)*puVar8) != '}') goto LAB_0015a684;
      iVar4 = 1;
      bVar29 = false;
    }
    if (*(uint **)((long)pvStack_7c8 + 0x10) != local_7b0) {
      uVar16 = 0x19;
      goto LAB_0015a689;
    }
    puVar20 = puVar8 + 1;
    bVar28 = false;
  }
  if (bVar29) {
    do {
      if (iVar4 != 2) goto LAB_0015af16;
      if (puVar20 <= local_7b0) goto LAB_0015b003;
      uVar13 = (ulong)*puVar20;
      uVar16 = 3;
      if ((*(char *)((long)pvVar6 + uVar13) != '\"') ||
         (*(char *)((long)pvVar6 + (ulong)puVar20[1]) != ':')) goto LAB_0015a689;
      if ((*(char *)((long)pvVar6 + uVar13 + 6) == '\"') &&
         (*(char *)((long)pvVar6 + uVar13 + 5) == 't' &&
          *(int *)((long)pvVar6 + uVar13 + 1) == 0x6e657665)) goto LAB_00159ed0;
      puVar7 = puVar20 + 3;
      uVar5 = *(byte *)((long)pvVar6 + (ulong)puVar20[2]) - 0x2c;
      if (((uVar5 < 0x30) && ((0x800000004001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
         (iVar4 = 2, *(byte *)((long)pvVar6 + (ulong)puVar20[2]) == 0x7b)) {
        if (puVar7 < (uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2])) {
          iVar21 = 3;
          do {
            uVar5 = *puVar7;
            puVar7 = puVar7 + 1;
            bVar3 = *(byte *)((long)pvVar6 + (ulong)uVar5);
            if (bVar3 < 0x7b) {
              if (bVar3 == 0x5b) {
LAB_00159cf6:
                iVar21 = iVar21 + 1;
              }
              else if (bVar3 == 0x5d) goto LAB_00159cfc;
            }
            else {
              if (bVar3 != 0x7d) {
                if (bVar3 != 0x7b) goto LAB_00159d04;
                goto LAB_00159cf6;
              }
LAB_00159cfc:
              iVar4 = iVar21 + -1;
              bVar29 = iVar21 < 4;
              iVar21 = iVar4;
              if (bVar29) goto LAB_00159d1b;
            }
LAB_00159d04:
            if ((uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2]) <= puVar7)
            goto LAB_0015a684;
          } while( true );
        }
        goto LAB_0015a689;
      }
LAB_00159d1b:
      if (puVar7 <= local_7b0) goto LAB_0015b003;
      if (iVar4 != 2) goto LAB_0015b022;
      bVar29 = true;
      iVar4 = 2;
      if (*(char *)((long)pvVar6 + (ulong)*puVar7) != ',') {
        if (*(char *)((long)pvVar6 + (ulong)*puVar7) != '}') goto LAB_0015a689;
        iVar4 = 1;
        bVar29 = false;
      }
      puVar20 = puVar7 + 1;
    } while (bVar29);
  }
  uVar16 = 0x13;
  if (!bVar28) {
    *(uint **)((long)pvStack_7c8 + 0x10) = local_7b0;
    bVar28 = *(char *)((long)pvVar6 + (ulong)local_7b0[1]) != '}';
    if (bVar28) {
      cVar14 = bVar28 + '\x01';
      do {
        if (cVar14 != '\x02') {
LAB_0015af9e:
          __assert_fail("_json_iter->_depth == _depth",
                        "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                        ,0x6566,
                        "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                       );
        }
        if (puVar27 <= local_7b0) goto LAB_0015b003;
        uVar13 = (ulong)*puVar27;
        if (*(char *)((long)pvVar6 + uVar13) != '\"') {
LAB_0015afdc:
          __assert_fail("!error",
                        "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                        ,0x656e,
                        "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                       );
        }
        if (*(char *)((long)pvVar6 + (ulong)puVar27[1]) != ':') {
LAB_0015afbd:
          __assert_fail("!error",
                        "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                        ,0x6571,
                        "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                       );
        }
        if ((*(char *)((long)pvVar6 + uVar13 + 6) == '\"') &&
           (puVar20 = puVar27,
           *(char *)((long)pvVar6 + uVar13 + 5) == 't' &&
           *(int *)((long)pvVar6 + uVar13 + 1) == 0x6e657665)) goto LAB_00159ed0;
        puVar20 = puVar27 + 3;
        uVar5 = *(byte *)((long)pvVar6 + (ulong)puVar27[2]) - 0x2c;
        if (((uVar5 < 0x30) && ((0x800000004001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
           (iVar4 = 2, *(byte *)((long)pvVar6 + (ulong)puVar27[2]) == 0x7b)) {
          if (puVar20 < (uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2])) {
            iVar21 = 3;
            do {
              uVar5 = *puVar20;
              puVar20 = puVar20 + 1;
              bVar3 = *(byte *)((long)pvVar6 + (ulong)uVar5);
              if (bVar3 < 0x7b) {
                if (bVar3 == 0x5b) {
LAB_00159e59:
                  iVar21 = iVar21 + 1;
                }
                else if (bVar3 == 0x5d) goto LAB_00159e5f;
              }
              else {
                if (bVar3 != 0x7d) {
                  if (bVar3 != 0x7b) goto LAB_00159e67;
                  goto LAB_00159e59;
                }
LAB_00159e5f:
                iVar4 = iVar21 + -1;
                bVar28 = iVar21 < 4;
                iVar21 = iVar4;
                if (bVar28) goto LAB_00159e7e;
              }
LAB_00159e67:
              if ((uint *)((ulong)*(uint *)(local_7f0 + 1) * 4 + local_7f0[2]) <= puVar20) break;
            } while( true );
          }
          goto LAB_0015a684;
        }
LAB_00159e7e:
        if (puVar20 == puVar8) goto LAB_0015a689;
        if (puVar20 <= local_7b0) goto LAB_0015b003;
        if (iVar4 != 2) goto LAB_0015b022;
        bVar28 = true;
        cVar14 = '\x02';
        if (*(char *)((long)pvVar6 + (ulong)*puVar20) != ',') {
          if (*(char *)((long)pvVar6 + (ulong)*puVar20) != '}') {
LAB_0015b047:
            __assert_fail("!error",
                          "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                          ,0x658d,
                          "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                         );
          }
          cVar14 = '\x01';
          bVar28 = false;
        }
        puVar27 = puVar20 + 1;
        if (!bVar28) break;
      } while( true );
    }
LAB_0015af7d:
    __assert_fail("has_value",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x6565,
                  "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                 );
  }
LAB_0015a689:
  puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar10 = &PTR__exception_001eae70;
  *(undefined4 *)(puVar10 + 1) = uVar16;
  __cxa_throw(puVar10,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
}

Assistant:

void MarketGenerator::generate() {
	
	for (;;) {

		{
			std::scoped_lock<std::mutex> lk(mut_);

			try {
				session_id_ = Betfair_Auth::get_session_id();

				std::string start_time = Timing::now();
				std::string end_time = Timing::after(time_span_, time_unit_);

				io_service service;
				ssl::context context{ ssl::context::tlsv12_client };

				Client<Rest_Client> rest_cl{ config::betting_host, config::betting_port, service, context };
				rest_cl.send_request(rest::message<params::market_catalogue>, params::market_catalogue(session_id_, start_time, end_time));
				simdjson::padded_string p_d{ std::move(rest_cl.recv_response()) };

				simdjson::ondemand::parser parser;

				for (simdjson::ondemand::object market : parser.iterate(p_d)) {
					std::string m_id = std::string(std::string_view(market["marketId"]));
					std::string m_tm = std::string(std::string_view(market["marketStartTime"]));
					std::string event_type = std::string(std::string_view(market["eventType"]["id"]));
					std::string country_code = std::string(std::string_view(market["event"]["countryCode"]));
					markets_.push({ m_id, Market_Projection{m_tm, event_type, country_code} });
				}
			} catch (boost::system::system_error e) {
				spdlog::error(e.what());
			} catch (...) {
				spdlog::error("invalid config info");
				throw std::exception();
			}
		}
		data_cond_.notify_all();
		std::this_thread::sleep_for(std::chrono::seconds(calc_time()));
	}
}